

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepScanLineOutputFile::copyPixels(DeepScanLineOutputFile *this,DeepScanLineInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *pAVar7;
  LineOrder *pLVar8;
  Compression *pCVar9;
  Box2i *pBVar10;
  LogicExc *this_00;
  Data *partdata;
  Data *pDVar11;
  char *in_RSI;
  long in_RDI;
  char *pixelData;
  char *sampleCountTable;
  uint64_t unpackedDataSize;
  uint64_t packedDataSize;
  uint64_t packedSampleCountSize;
  bytesOruint64_t tmp;
  uint64_t dataSize;
  vector<char,_std::allocator<char>_> data;
  stringstream _iex_throw_s_5;
  Box2i *dataWindow;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  lock_guard<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e0;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffff3e8;
  undefined4 in_stack_fffffffffffff3f0;
  int in_stack_fffffffffffff3f4;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff3f8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff400;
  uint64_t unpackedDataSize_00;
  undefined4 in_stack_fffffffffffff410;
  char *in_stack_fffffffffffff418;
  undefined4 in_stack_fffffffffffff420;
  int in_stack_fffffffffffff424;
  ChannelList *in_stack_fffffffffffff428;
  DeepScanLineInputFile *in_stack_fffffffffffff430;
  OutputStreamMutex *filedata;
  undefined4 in_stack_fffffffffffff440;
  undefined4 uVar12;
  allocator<char> *sampleCountTableSize;
  allocator<char> local_989;
  undefined1 local_988 [40];
  ostream local_960 [264];
  uint64_t *in_stack_fffffffffffff7a8;
  char *in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7bc;
  DeepScanLineInputFile *in_stack_fffffffffffff7c0;
  stringstream local_7e0 [16];
  ostream local_7d0 [376];
  stringstream local_658 [16];
  ostream local_648 [376];
  stringstream local_4d0 [16];
  ostream local_4c0 [376];
  stringstream local_348 [16];
  ostream local_338 [376];
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  Header *local_28;
  undefined8 local_20;
  char *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffff3e0,
             (mutex_type *)in_stack_fffffffffffff3d8);
  local_20 = *(undefined8 *)(in_RDI + 8);
  local_28 = DeepScanLineInputFile::header(in_stack_fffffffffffff430);
  bVar3 = Header::hasType((Header *)0x1b0c17);
  if (bVar3) {
    Header::type_abi_cxx11_((Header *)0x1b0c3a);
    bVar3 = std::operator!=(in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
    if (!bVar3) {
      Header::dataWindow((Header *)0x1b0ded);
      Header::dataWindow((Header *)0x1b0e04);
      bVar3 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                        ((Box<Imath_3_2::Vec2<int>_> *)
                         CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                         in_stack_fffffffffffff3e8);
      if (!bVar3) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_348);
        poVar5 = std::operator<<(local_338,"Cannot copy pixels from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b0e6e);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1b0ec2);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\". The files have different data windows.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar7,local_348);
        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pLVar8 = Header::lineOrder((Header *)0x1b0f9e);
      LVar1 = *pLVar8;
      pLVar8 = Header::lineOrder((Header *)0x1b0fc6);
      if (LVar1 != *pLVar8) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_4d0);
        poVar5 = std::operator<<(local_4c0,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b102a);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1b107e);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" failed. The files have different line orders.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar7,local_4d0);
        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pCVar9 = Header::compression((Header *)0x1b115a);
      CVar2 = *pCVar9;
      pCVar9 = Header::compression((Header *)0x1b1182);
      if (CVar2 != *pCVar9) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_658);
        poVar5 = std::operator<<(local_648,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b11e6);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1b123a);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" failed. The files use different compression methods.");
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar7,local_658);
        __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      Header::channels((Header *)0x1b1316);
      Header::channels((Header *)0x1b132d);
      bVar3 = ChannelList::operator==
                        (in_stack_fffffffffffff428,
                         (ChannelList *)
                         CONCAT44(in_stack_fffffffffffff424,in_stack_fffffffffffff420));
      if (bVar3) {
        pBVar10 = Header::dataWindow((Header *)0x1b14d9);
        if (*(int *)(*(long *)(in_RDI + 8) + 0xb4) == ((pBVar10->max).y - (pBVar10->min).y) + 1) {
          sampleCountTableSize = &local_989;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffff400,(size_type)in_stack_fffffffffffff3f8,
                     (allocator_type *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)
                    );
          std::allocator<char>::~allocator(&local_989);
          while (0 < *(int *)(*(long *)(in_RDI + 8) + 0xb4)) {
            filedata = (OutputStreamMutex *)local_988;
            partdata = (Data *)std::vector<char,_std::allocator<char>_>::size
                                         ((vector<char,_std::allocator<char>_> *)filedata);
            uVar12 = *(undefined4 *)(*(long *)(in_RDI + 8) + 0xb0);
            std::vector<char,_std::allocator<char>_>::operator[]
                      ((vector<char,_std::allocator<char>_> *)filedata,0);
            DeepScanLineInputFile::rawPixelData
                      (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b0
                       ,in_stack_fffffffffffff7a8);
            pDVar11 = (Data *)std::vector<char,_std::allocator<char>_>::size
                                        ((vector<char,_std::allocator<char>_> *)local_988);
            if (pDVar11 < partdata) {
              std::vector<char,_std::allocator<char>_>::resize
                        (in_stack_fffffffffffff400,(size_type)in_stack_fffffffffffff3f8);
              in_stack_fffffffffffff424 = *(int *)(*(long *)(in_RDI + 8) + 0xb0);
              in_stack_fffffffffffff418 = local_10;
              std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_988,0);
              DeepScanLineInputFile::rawPixelData
                        (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,
                         in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
            }
            in_stack_fffffffffffff3f8 = (vector<char,_std::allocator<char>_> *)local_988;
            std::vector<char,_std::allocator<char>_>::operator[](in_stack_fffffffffffff3f8,4);
            std::vector<char,_std::allocator<char>_>::operator[](in_stack_fffffffffffff3f8,0xc);
            std::vector<char,_std::allocator<char>_>::operator[](in_stack_fffffffffffff3f8,0x14);
            std::vector<char,_std::allocator<char>_>::operator[](in_stack_fffffffffffff3f8,0);
            in_stack_fffffffffffff400 = *(vector<char,_std::allocator<char>_> **)(in_RDI + 8);
            unpackedDataSize_00 =
                 *(uint64_t *)
                  &in_stack_fffffffffffff400[0xf].super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.field_0x8;
            iVar4 = lineBufferMinY(*(int *)&in_stack_fffffffffffff400[7].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            field_0x8,
                                   *(int *)&in_stack_fffffffffffff400[8].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            field_0x4,
                                   *(int *)&in_stack_fffffffffffff400[0xd].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            field_0x8);
            anon_unknown_6::writePixelData
                      (filedata,partdata,in_stack_fffffffffffff424,in_stack_fffffffffffff418,
                       CONCAT44(iVar4,in_stack_fffffffffffff410),unpackedDataSize_00,
                       (char *)CONCAT44(uVar12,in_stack_fffffffffffff440),
                       (uint64_t)sampleCountTableSize);
            if (*(int *)(*(long *)(in_RDI + 8) + 0xb8) == 0) {
              in_stack_fffffffffffff3f4 = *(int *)(*(long *)(in_RDI + 8) + 0x140);
            }
            else {
              in_stack_fffffffffffff3f4 = -*(int *)(*(long *)(in_RDI + 8) + 0x140);
            }
            *(int *)(*(long *)(in_RDI + 8) + 0xb0) =
                 in_stack_fffffffffffff3f4 + *(int *)(*(long *)(in_RDI + 8) + 0xb0);
            *(int *)(*(long *)(in_RDI + 8) + 0xb4) =
                 *(int *)(*(long *)(in_RDI + 8) + 0xb4) - *(int *)(*(long *)(in_RDI + 8) + 0x140);
          }
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
          std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b1a4b);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)(local_988 + 0x18));
        poVar5 = std::operator<<(local_960,"Quick pixel copy from image file \"");
        pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b1569);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" to image file \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1b15bd);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" failed. \"");
        pcVar6 = fileName((DeepScanLineOutputFile *)0x1b1611);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" already contains pixel data.");
        this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::LogicExc::LogicExc(this_00,(stringstream *)(local_988 + 0x18));
        __cxa_throw(this_00,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_7e0);
      poVar5 = std::operator<<(local_7d0,"Quick pixel copy from image file \"");
      pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b13a9);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\" to image file \"");
      pcVar6 = fileName((DeepScanLineOutputFile *)0x1b13fd);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,"\" failed.  The files have different channel lists.");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar7,local_7e0);
      __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1c0);
  poVar5 = std::operator<<(local_1b0,"Cannot copy pixels from image file \"");
  pcVar6 = DeepScanLineInputFile::fileName((DeepScanLineInputFile *)0x1b0ca4);
  poVar5 = std::operator<<(poVar5,pcVar6);
  poVar5 = std::operator<<(poVar5,"\" to image file \"");
  pcVar6 = fileName((DeepScanLineOutputFile *)0x1b0cf8);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\": the input needs to be a deep scanline image");
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar7,local_1c0);
  __cxa_throw(pAVar7,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineOutputFile::copyPixels (DeepScanLineInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!inHdr.hasType () || inHdr.type () != DEEPSCANLINE)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\": the input needs to be a deep scanline image");
    }
    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    vector<char> data (4096);

    while (_data->missingScanLines > 0)
    {
        uint64_t dataSize = (uint64_t) data.size ();
        in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            // block wasn't big enough - go again with enough memory this time
            data.resize (dataSize);
            in.rawPixelData (_data->currentScanLine, &data[0], dataSize);
        }

        // extract header from block to pass to writePixelData

        bytesOruint64_t tmp;
        memcpy (&tmp.b, &data[4], 8);
        uint64_t packedSampleCountSize = tmp.i;

        memcpy (&tmp.b, &data[12], 8);
        uint64_t packedDataSize = tmp.i;

        memcpy (&tmp.b, &data[20], 8);
        uint64_t unpackedDataSize = tmp.i;

        const char* sampleCountTable = &data[0] + 28;
        const char* pixelData        = sampleCountTable + packedSampleCountSize;

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            packedDataSize,
            unpackedDataSize,
            sampleCountTable,
            packedSampleCountSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}